

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

shared_ptr<Buffer> __thiscall QPDFWriter::getBufferSharedPointer(QPDFWriter *this)

{
  Buffer *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFWriter *in_RSI;
  shared_ptr<Buffer> sVar1;
  QPDFWriter *this_local;
  
  __p = getBuffer(in_RSI);
  std::shared_ptr<Buffer>::shared_ptr<Buffer,void>((shared_ptr<Buffer> *)this,__p);
  sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Buffer>)sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Buffer>
QPDFWriter::getBufferSharedPointer()
{
    return std::shared_ptr<Buffer>(getBuffer());
}